

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O1

int limit_xm_resize(void *f,long n)

{
  undefined8 *puVar1;
  int32 iVar2;
  void *pvVar3;
  
  puVar1 = *(undefined8 **)((long)f + 8);
  if (n == 0 && (void *)*puVar1 == (void *)0x0) {
    *puVar1 = 0;
    puVar1[3] = 0;
  }
  else {
    if ((long)puVar1[3] < n) {
      pvVar3 = realloc((void *)*puVar1,n);
      if (pvVar3 == (void *)0x0) {
        return -1;
      }
      *puVar1 = pvVar3;
      memset((void *)((long)pvVar3 + puVar1[3]),0,n - puVar1[3]);
      puVar1[3] = n;
    }
    iVar2 = dumbfile_getnc((char *)*puVar1,(int32)n,(DUMBFILE *)puVar1[4]);
    if (iVar2 < n) {
      return -1;
    }
  }
  puVar1[2] = n;
  puVar1[1] = 0;
  return 0;
}

Assistant:

static int DUMBCALLBACK limit_xm_resize(void *f, long n)
{
	DUMBFILE *df = f;
	LIMITED_XM *lx = df->file;
	if (lx->buffered || n) {
		if (n > lx->allocated) {
			unsigned char *buffered = realloc( lx->buffered, n );
			if ( !buffered ) return -1;
			lx->buffered = buffered;
			memset( buffered + lx->allocated, 0, n - lx->allocated );
			lx->allocated = n;
		}
        if ( dumbfile_getnc( (char *)lx->buffered, n, lx->remaining ) < n ) return -1;
	} else if (!n) {
		if ( lx->buffered ) free( lx->buffered );
		lx->buffered = NULL;
		lx->allocated = 0;
	}
	lx->limit = n;
	lx->ptr = 0;
	return 0;
}